

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void stream_cork(cubeb_stream_conflict *stm,cork_state state)

{
  cork_state in_ESI;
  pa_stream *in_RDI;
  cubeb_stream_conflict *unaff_retaddr;
  cubeb_state in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*(long *)in_RDI + 0x10));
  cork_io_stream(unaff_retaddr,in_RDI,in_ESI);
  cork_io_stream(unaff_retaddr,in_RDI,in_ESI);
  (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*(long *)in_RDI + 0x10));
  if ((in_ESI & NOTIFY) != UNCORK) {
    stream_state_change_callback
              ((cubeb_stream_conflict *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void
stream_cork(cubeb_stream * stm, enum cork_state state)
{
  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  cork_io_stream(stm, stm->output_stream, state);
  cork_io_stream(stm, stm->input_stream, state);
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  if (state & NOTIFY) {
    stream_state_change_callback(stm, state & CORK ? CUBEB_STATE_STOPPED
                                                   : CUBEB_STATE_STARTED);
  }
}